

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

ident * newident(char *name,int flags)

{
  bool bVar1;
  char *n;
  ident local_68;
  ident *local_28;
  ident *id;
  char *pcStack_18;
  int flags_local;
  char *name_local;
  
  id._4_4_ = flags;
  pcStack_18 = name;
  local_28 = hashset<ident>::access<char_const*>(&idents,&stack0xffffffffffffffe8);
  if (local_28 == (ident *)0x0) {
    bVar1 = checknumber(pcStack_18);
    if (bVar1) {
      debugcode("number %s is not a valid identifier name",pcStack_18);
      return dummyident;
    }
    n = newstring(pcStack_18);
    ident::ident(&local_68,4,n,id._4_4_);
    local_28 = addident(&local_68);
  }
  return local_28;
}

Assistant:

ident *newident(const char *name, int flags)
{
    ident *id = idents.access(name);
    if(!id)
    {
        if(checknumber(name))
        {
            debugcode("number %s is not a valid identifier name", name);
            return dummyident;
        }
        id = addident(ident(ID_ALIAS, newstring(name), flags));
    }
    return id;
}